

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O2

void poly1305_add(uint32_t *h,uint32_t *x)

{
  long lVar1;
  uint uVar2;
  
  uVar2 = 0;
  for (lVar1 = 0; lVar1 != 0x11; lVar1 = lVar1 + 1) {
    uVar2 = uVar2 + h[lVar1] + x[lVar1];
    h[lVar1] = uVar2 & 0xff;
    uVar2 = uVar2 >> 8;
  }
  return;
}

Assistant:

static void poly1305_add(uint32_t h[17],
                         const uint32_t x[17])
{
  uint32_t carry = 0;
  int i;

  for (i = 0; i < 17; i++)
  {
    carry += h[i] + x[i];
    h[i] = carry & 0xff;
    carry >>= 8;
  }
}